

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.cpp
# Opt level: O0

int NULLC::SafeSprintf(char *dst,size_t size,char *src,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int local_10c;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined4 local_48;
  int result;
  va_list args;
  char *src_local;
  size_t size_local;
  char *dst_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (size == 0) {
    dst_local._4_4_ = 0;
  }
  else {
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    result = 0x30;
    local_48 = 0x18;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    local_10c = vsnprintf(dst,size,src,&local_48);
    dst[size - 1] = '\0';
    if ((local_10c == -1) || (size <= (ulong)(long)local_10c)) {
      local_10c = (int)size;
    }
    dst_local._4_4_ = local_10c;
  }
  return dst_local._4_4_;
}

Assistant:

int	NULLC::SafeSprintf(char* dst, size_t size, const char* src, ...)
{
	if(size == 0)
		return 0;

	va_list args;
	va_start(args, src);

	int result = vsnprintf(dst, size, src, args);
	dst[size - 1] = '\0';

	va_end(args);

	return (result == -1 || (size_t)result >= size) ? (int)size : result;
}